

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::UpdateArrayValueTypes(BackwardPass *this,Instr *instr,Opnd *origOpnd)

{
  byte bVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  byte bVar7;
  ObjectType OVar8;
  ObjectType OVar9;
  ValueType VVar10;
  undefined4 *puVar11;
  IndirOpnd *pIVar12;
  RegOpnd *pRVar13;
  SymOpnd *pSVar14;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  StackSym *pSVar15;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  RegOpnd *pRVar16;
  ArrayRegOpnd *pAVar17;
  StackSym *pSVar18;
  char *pcVar19;
  undefined8 extraout_RDX;
  int i_1;
  ulong uVar20;
  Instr *pIVar21;
  char cVar22;
  uint uVar23;
  Opnd *checkedSrc_1;
  Instr *pIVar24;
  Instr *this_00;
  int i;
  long lVar25;
  Opnd *checkedSrc;
  Opnd *pOStack_88;
  ValueType checkedSrcValueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_72;
  RegOpnd *local_70;
  uint local_64;
  Instr *local_60;
  uint local_54;
  ArrayRegOpnd *local_50;
  uint local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  uint local_34;
  ValueType valueType;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1372,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar4) goto LAB_003d075e;
    *puVar11 = 0;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1373,"(!IsPrePass())","!IsPrePass()");
    if (!bVar4) goto LAB_003d075e;
    *puVar11 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1374,"(instr)","instr");
    if (!bVar4) goto LAB_003d075e;
    *puVar11 = 0;
  }
  if (origOpnd == (Opnd *)0x0) {
    return;
  }
  if ((instr->m_opcode & ~ExtendedOpcodePrefix) == StElemC) {
    return;
  }
  OVar5 = IR::Opnd::GetKind(origOpnd);
  local_70 = (RegOpnd *)origOpnd;
  if (OVar5 == OpndKindSym) {
    pSVar14 = IR::Opnd::AsSymOpnd(origOpnd);
    if (pSVar14->m_sym->m_kind != SymKindProperty) {
      return;
    }
    local_50 = (ArrayRegOpnd *)0x0;
  }
  else {
    if (OVar5 != OpndKindReg) {
      if (OVar5 != OpndKindIndir) {
        return;
      }
      pIVar12 = IR::Opnd::AsIndirOpnd(origOpnd);
      local_70 = pIVar12->m_baseOpnd;
    }
    pRVar13 = IR::Opnd::AsRegOpnd(&local_70->super_Opnd);
    bVar4 = IR::RegOpnd::IsArrayRegOpnd(pRVar13);
    if (bVar4) {
      local_50 = IR::RegOpnd::AsArrayRegOpnd(pRVar13);
    }
    else {
      local_50 = (ArrayRegOpnd *)0x0;
    }
  }
  local_36 = (local_70->super_Opnd).m_valueType.field_0;
  bVar4 = ValueType::IsAnyOptimizedArray((ValueType *)&local_36.field_0);
  if (!bVar4) {
    return;
  }
  local_60 = instr;
  bVar4 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_36.field_0);
  bVar6 = ValueType::IsOptimizedTypedArray((ValueType *)&local_36.field_0);
  pRVar13 = local_70;
  if (bVar4 == bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x13aa,"(!isJsArray == valueType.IsOptimizedTypedArray())",
                       "!isJsArray == valueType.IsOptimizedTypedArray()");
    if (!bVar6) goto LAB_003d075e;
    *puVar11 = 0;
  }
  bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this->currentBlock->noImplicitCallUses);
  local_3c = CONCAT31(local_3c._1_3_,bVar7);
  if (bVar4) {
    bVar1 = (pRVar13->super_Opnd).field_0xb;
    local_54 = (uint)CONCAT71(extraout_var,bVar1) ^ 1;
    if ((bVar1 & 1) == 0) {
      bVar6 = ValueType::HasVarElements((ValueType *)&local_36.field_0);
      if (bVar6) {
        uVar20 = 0;
      }
      else {
        bVar6 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                          (this->currentBlock->noImplicitCallNativeArrayUses);
        uVar20 = CONCAT71(extraout_var_00,bVar6) & 0xffffffff;
      }
      bVar7 = (byte)local_3c;
    }
    else {
      uVar20 = 0;
    }
    local_54 = CONCAT31((int3)(local_54 >> 8),(byte)local_54 & bVar7);
    if ((((pRVar13->super_Opnd).field_0xb & 1) != 0) ||
       (bVar6 = ValueType::HasNoMissingValues((ValueType *)&local_36.field_0), !bVar6))
    goto LAB_003cffd0;
    bVar6 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      (this->currentBlock->noImplicitCallNoMissingValuesUses);
    local_34 = (uint)CONCAT71(extraout_var_01,bVar6);
  }
  else {
    uVar20 = 0;
    local_54 = 0;
LAB_003cffd0:
    local_34 = 0;
  }
  pIVar21 = local_60;
  bVar6 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                    (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses);
  local_48 = (uint)uVar20;
  if (local_50 == (ArrayRegOpnd *)0x0 || !bVar4) {
    local_44 = 0;
    if (local_50 != (ArrayRegOpnd *)0x0) goto LAB_003d0029;
    local_3c = (undefined4)CONCAT71(extraout_var_02,1);
    uVar23 = 0;
    local_40 = 0;
  }
  else {
    local_44 = (undefined4)
               CONCAT71((int7)((ulong)extraout_RDX >> 8),
                        local_50->headSegmentSym != (StackSym *)0x0 && bVar6);
LAB_003d0029:
    bVar7 = (byte)local_3c;
    if (bVar4) {
      bVar7 = bVar6;
    }
    uVar23 = (uint)(bVar7 & local_50->headSegmentLengthSym != (StackSym *)0x0);
    if (local_50 == (ArrayRegOpnd *)0x0 || !bVar4) {
LAB_003d00e1:
      local_40 = 0;
    }
    else {
      pSVar15 = IR::ArrayRegOpnd::LengthSym(local_50);
      if ((pSVar15 != (StackSym *)0x0) &&
         (bVar6 = ValueType::IsArray((ValueType *)&local_36.field_0), !bVar6)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x13be,
                           "(!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray())"
                           ,
                           "!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray()"
                          );
        if (!bVar6) goto LAB_003d075e;
        *puVar11 = 0;
        pIVar21 = local_60;
      }
      pSVar15 = IR::ArrayRegOpnd::LengthSym(local_50);
      if (pSVar15 == (StackSym *)0x0) goto LAB_003d00e1;
      bVar6 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                        (this->currentBlock->noImplicitCallArrayLengthSymUses);
      local_40 = (undefined4)CONCAT71(extraout_var_03,bVar6);
    }
    local_3c = 0;
    uVar20 = (ulong)local_48;
  }
  pRVar13 = local_70;
  pcVar19 = (char *)(ulong)local_34;
  if (((((char)local_54 != '\0' || (char)local_34 != '\0') || (char)uVar20 != '\0') ||
      ((char)local_44 != '\0')) || ((char)uVar23 != '\0')) {
    if (local_70 != (RegOpnd *)pIVar21->m_dst) {
      local_64 = uVar23;
      if (bVar4) {
        if (pIVar21->m_opcode == NoImplicitCallUses) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          pcVar19 = "instr->m_opcode != Js::OpCode::NoImplicitCallUses";
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                             "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
          if (!bVar4) goto LAB_003d075e;
          *puVar11 = 0;
        }
        do {
          while( true ) {
            pIVar21 = pIVar21->m_prev;
            if (((pIVar21 == (Instr *)0x0) || (pIVar21->m_kind == InstrKindLabel)) ||
               (pIVar21->m_kind == InstrKindProfiledLabel)) goto LAB_003d01d0;
            bVar4 = IR::Instr::IsRealInstr(pIVar21);
            if (!bVar4) break;
            if ((pIVar21->m_kind != InstrKindByteCodeUses) || (pIVar21->m_opcode != ByteCodeUses))
            goto LAB_003d01d0;
          }
        } while (pIVar21->m_opcode != NoImplicitCallUses);
LAB_003d01d0:
        for (; (pIVar21 != (Instr *)0x0 && (pIVar21->m_opcode == NoImplicitCallUses));
            pIVar21 = pIVar21->m_prev) {
          pOStack_88 = pIVar21->m_src1;
          _checkedSrcValueType = pIVar21->m_src2;
          for (lVar25 = 0; (lVar25 != 2 && (pOVar2 = (&pOStack_88)[lVar25], pOVar2 != (Opnd *)0x0));
              lVar25 = lVar25 + 1) {
            bVar4 = IR::Opnd::IsEqual(pOVar2,&pRVar13->super_Opnd);
            if (bVar4) {
              local_72 = (pOVar2->m_valueType).field_0;
              bVar4 = ValueType::IsLikelyObject((ValueType *)&local_72.field_0);
              if (bVar4) {
                OVar8 = ValueType::GetObjectType((ValueType *)&local_72.field_0);
                OVar9 = ValueType::GetObjectType((ValueType *)&local_36.field_0);
                pRVar13 = local_70;
                if (OVar8 == OVar9) {
                  pOStack_88 = (Opnd *)CONCAT62(pOStack_88._2_6_,(pOVar2->m_valueType).field_0.bits)
                  ;
                  if ((char)local_48 == '\0') {
                    local_48 = 0;
                    cVar22 = (char)local_34;
                    uVar23 = local_64;
                  }
                  else {
                    bVar4 = ValueType::HasVarElements((ValueType *)&pOStack_88);
                    uVar23 = local_64;
                    local_48 = (uint)CONCAT71((int7)((ulong)pcVar19 >> 8),1);
                    cVar22 = (char)local_34;
                    if (!bVar4) {
                      bVar4 = ValueType::HasIntElements((ValueType *)&pOStack_88);
                      bVar6 = ValueType::HasIntElements((ValueType *)&local_36.field_0);
                      local_48 = (uint)CONCAT71(extraout_var_04,bVar6 != bVar4);
                      pRVar13 = local_70;
                    }
                  }
                  if (cVar22 == '\0') {
                    pcVar19 = (char *)0x0;
                  }
                  else {
                    bVar4 = ValueType::HasNoMissingValues((ValueType *)&pOStack_88);
                    pcVar19 = (char *)(CONCAT71(extraout_var_05,bVar4) & 0xffffffff ^ 1);
                  }
                  pIVar21 = local_60;
                  if ((byte)((byte)local_44 | (byte)uVar23 | (byte)local_40) == 1) {
                    local_34 = (uint)pcVar19;
                    bVar4 = IR::Opnd::IsRegOpnd(pOVar2);
                    if (bVar4) {
                      pRVar16 = IR::Opnd::AsRegOpnd(pOVar2);
                      bVar4 = IR::RegOpnd::IsArrayRegOpnd(pRVar16);
                      if (bVar4) {
                        pRVar16 = IR::Opnd::AsRegOpnd(pOVar2);
                        pAVar17 = IR::RegOpnd::AsArrayRegOpnd(pRVar16);
                        if ((char)local_44 == '\0') {
                          local_44 = 0;
                        }
                        else {
                          local_44 = (undefined4)
                                     CONCAT71((int7)((ulong)pAVar17->headSegmentSym >> 8),
                                              pAVar17->headSegmentSym != local_50->headSegmentSym);
                        }
                        if ((byte)uVar23 == 0) {
                          uVar23 = 0;
                        }
                        else {
                          uVar23 = (uint)(pAVar17->headSegmentLengthSym !=
                                         local_50->headSegmentLengthSym);
                        }
                        if ((byte)local_40 == '\0') {
                          local_40 = 0;
                        }
                        else {
                          pSVar15 = IR::ArrayRegOpnd::LengthSym(pAVar17);
                          pSVar18 = IR::ArrayRegOpnd::LengthSym(local_50);
                          local_40 = (undefined4)
                                     CONCAT71((int7)((ulong)pSVar18 >> 8),pSVar15 != pSVar18);
                          pRVar13 = local_70;
                        }
                      }
                    }
                    pcVar19 = (char *)(ulong)local_34;
                  }
                  else {
                    local_40 = 0;
                    uVar23 = 0;
                    local_44 = 0;
                  }
                  local_54 = 0;
                  goto LAB_003d0582;
                }
              }
            }
          }
        }
        pcVar19 = (char *)(ulong)local_34;
        pIVar21 = local_60;
        uVar23 = local_64;
      }
      else {
        if ((char)uVar23 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x140e,"(removeHeadSegmentLengthSym)","removeHeadSegmentLengthSym");
          if (!bVar4) goto LAB_003d075e;
          *puVar11 = 0;
        }
        pRVar13 = IR::RegOpnd::New(local_50->headSegmentLengthSym,
                                   local_50->headSegmentLengthSym->m_type,pIVar21->m_func);
        pIVar24 = pIVar21;
        if (pIVar21->m_opcode == NoImplicitCallUses) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                             "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
          if (!bVar4) goto LAB_003d075e;
          *puVar11 = 0;
          pIVar21 = local_60;
          pIVar24 = local_60;
        }
        do {
          while( true ) {
            this_00 = pIVar21->m_prev;
            if (((this_00 == (Instr *)0x0) || (this_00->m_kind == InstrKindLabel)) ||
               (this_00->m_kind == InstrKindProfiledLabel)) goto LAB_003d0394;
            bVar4 = IR::Instr::IsRealInstr(this_00);
            pIVar21 = this_00;
            if (!bVar4) break;
            if ((this_00->m_kind != InstrKindByteCodeUses) || (this_00->m_opcode != ByteCodeUses))
            goto LAB_003d0394;
          }
        } while (this_00->m_opcode != NoImplicitCallUses);
LAB_003d0394:
        while( true ) {
          bVar7 = 1;
          pIVar21 = pIVar24;
          uVar23 = (uint)pcVar19;
          if ((this_00 == (Instr *)0x0) || (this_00->m_opcode != NoImplicitCallUses)) break;
          pOStack_88 = this_00->m_src1;
          _checkedSrcValueType = this_00->m_src2;
          for (lVar25 = 0; (lVar25 != 2 && (pOVar2 = (&pOStack_88)[lVar25], pOVar2 != (Opnd *)0x0));
              lVar25 = lVar25 + 1) {
            bVar4 = IR::Opnd::IsEqual(pOVar2,&pRVar13->super_Opnd);
            if ((bVar4) &&
               (pRVar16 = IR::Opnd::AsRegOpnd(pOVar2),
               pRVar16->m_sym == local_50->headSegmentLengthSym)) {
              bVar7 = 0;
              pIVar21 = local_60;
              uVar23 = local_34;
              goto LAB_003d03ff;
            }
          }
          this_00 = this_00->m_prev;
          pcVar19 = (char *)(ulong)local_34;
          pIVar24 = local_60;
        }
LAB_003d03ff:
        pcVar19 = (char *)(ulong)uVar23;
        IR::RegOpnd::FreeInternal(pRVar13,pIVar21->m_func);
        uVar23 = (uint)((byte)local_64 & bVar7);
        pRVar13 = local_70;
      }
    }
LAB_003d0582:
    pAVar17 = local_50;
    if (((char)local_48 != '\0') || ((char)local_54 != '\0')) {
      if ((byte)local_3c == '\0') {
        pRVar13 = IR::ArrayRegOpnd::CopyAsRegOpnd(local_50,pIVar21->m_func);
        bVar4 = IR::Opnd::IsIndirOpnd(origOpnd);
        if (bVar4) {
          pIVar12 = IR::Opnd::AsIndirOpnd(origOpnd);
          pRVar16 = IR::Opnd::AsRegOpnd(&pRVar13->super_Opnd);
          IR::IndirOpnd::ReplaceBaseOpnd(pIVar12,pRVar16);
        }
        else {
          IR::Instr::Replace(pIVar21,(Opnd *)pAVar17,&pRVar13->super_Opnd);
        }
      }
      VVar10 = ValueType::ToLikely((ValueType *)&local_36.field_0);
      IR::Opnd::SetValueType(&pRVar13->super_Opnd,VVar10);
      return;
    }
    if ((char)pcVar19 != '\0') {
      VVar10 = ValueType::SetHasNoMissingValues((ValueType *)&local_36.field_0,false);
      IR::Opnd::SetValueType(&pRVar13->super_Opnd,VVar10);
    }
    pAVar17 = local_50;
    if ((char)local_44 != '\0') {
      if ((byte)local_3c != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x143e,"(arrayOpnd)","arrayOpnd");
        if (!bVar4) goto LAB_003d075e;
        *puVar11 = 0;
      }
      pAVar17->headSegmentSym = (StackSym *)0x0;
    }
    if ((char)uVar23 != '\0') {
      if ((byte)local_3c != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1443,"(arrayOpnd)","arrayOpnd");
        if (!bVar4) goto LAB_003d075e;
        *puVar11 = 0;
      }
      pAVar17->headSegmentLengthSym = (StackSym *)0x0;
    }
    pAVar17 = local_50;
    if ((byte)local_40 != '\0') {
      if ((byte)local_3c != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1448,"(arrayOpnd)","arrayOpnd");
        if (!bVar4) {
LAB_003d075e:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar11 = 0;
      }
      IR::ArrayRegOpnd::RemoveLengthSym(pAVar17);
    }
  }
  return;
}

Assistant:

void
BackwardPass::UpdateArrayValueTypes(IR::Instr *const instr, IR::Opnd *origOpnd)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(!IsPrePass());
    Assert(instr);

    if(!origOpnd)
    {
        return;
    }

    IR::Instr *opndOwnerInstr = instr;
    switch(instr->m_opcode)
    {
        case Js::OpCode::StElemC:
        case Js::OpCode::StArrSegElemC:
            // These may not be fixed if we are unsure about the type of the array they're storing to
            // (because it relies on profile data) and we weren't able to hoist the array check.
            return;
    }

    Sym *sym;
    IR::Opnd* opnd = origOpnd;
    IR::ArrayRegOpnd *arrayOpnd;
    switch(opnd->GetKind())
    {
        case IR::OpndKindIndir:
            opnd = opnd->AsIndirOpnd()->GetBaseOpnd();
            // fall-through

        case IR::OpndKindReg:
        {
            IR::RegOpnd *const regOpnd = opnd->AsRegOpnd();
            sym = regOpnd->m_sym;
            arrayOpnd = regOpnd->IsArrayRegOpnd() ? regOpnd->AsArrayRegOpnd() : nullptr;
            break;
        }

        case IR::OpndKindSym:
            sym = opnd->AsSymOpnd()->m_sym;
            if(!sym->IsPropertySym())
            {
                return;
            }
            arrayOpnd = nullptr;
            break;

        default:
            return;
    }

    const ValueType valueType(opnd->GetValueType());
    if(!valueType.IsAnyOptimizedArray())
    {
        return;
    }

    const bool isJsArray = valueType.IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueType.IsOptimizedTypedArray());

    const bool noForwardImplicitCallUses = currentBlock->noImplicitCallUses->IsEmpty();
    bool changeArray = isJsArray && !opnd->IsValueTypeFixed() && noForwardImplicitCallUses;
    bool changeNativeArray =
        isJsArray &&
        !opnd->IsValueTypeFixed() &&
        !valueType.HasVarElements() &&
        currentBlock->noImplicitCallNativeArrayUses->IsEmpty();
    bool changeNoMissingValues =
        isJsArray &&
        !opnd->IsValueTypeFixed() &&
        valueType.HasNoMissingValues() &&
        currentBlock->noImplicitCallNoMissingValuesUses->IsEmpty();
    const bool noForwardJsArrayHeadSegmentSymUses = currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty();
    bool removeHeadSegmentSym = isJsArray && arrayOpnd && arrayOpnd->HeadSegmentSym() && noForwardJsArrayHeadSegmentSymUses;
    bool removeHeadSegmentLengthSym =
        arrayOpnd &&
        arrayOpnd->HeadSegmentLengthSym() &&
        (isJsArray ? noForwardJsArrayHeadSegmentSymUses : noForwardImplicitCallUses);
    Assert(!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray());
    bool removeLengthSym =
        isJsArray &&
        arrayOpnd &&
        arrayOpnd->LengthSym() &&
        currentBlock->noImplicitCallArrayLengthSymUses->IsEmpty();
    if(!(changeArray || changeNoMissingValues || changeNativeArray || removeHeadSegmentSym || removeHeadSegmentLengthSym))
    {
        return;
    }

    // We have a definitely-array value type for the base, but either implicit calls are not currently being disabled for
    // legally using the value type as a definite array, or we are not currently bailing out upon creating a missing value
    // for legally using the value type as a definite array with no missing values.

    // For source opnds, ensure that a NoImplicitCallUses immediately precedes this instruction. Otherwise, convert the value
    // type to an appropriate version so that the lowerer doesn't incorrectly treat it as it says.
    if(opnd != opndOwnerInstr->GetDst())
    {
        if(isJsArray)
        {
            IR::Opnd *const checkedSrc =
                FindNoImplicitCallUse(
                    instr,
                    opnd,
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                        return
                            checkedSrcValueType.IsLikelyObject() &&
                            checkedSrcValueType.GetObjectType() == valueType.GetObjectType();
                    });
            if(checkedSrc)
            {
                // Implicit calls will be disabled to the point immediately before this instruction
                changeArray = false;

                const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                if(changeNativeArray &&
                    !checkedSrcValueType.HasVarElements() &&
                    checkedSrcValueType.HasIntElements() == valueType.HasIntElements())
                {
                    // If necessary, instructions before this will bail out on converting a native array
                    changeNativeArray = false;
                }

                if(changeNoMissingValues && checkedSrcValueType.HasNoMissingValues())
                {
                    // If necessary, instructions before this will bail out on creating a missing value
                    changeNoMissingValues = false;
                }

                if((removeHeadSegmentSym || removeHeadSegmentLengthSym || removeLengthSym) && checkedSrc->IsRegOpnd())
                {
                    IR::RegOpnd *const checkedRegSrc = checkedSrc->AsRegOpnd();
                    if(checkedRegSrc->IsArrayRegOpnd())
                    {
                        IR::ArrayRegOpnd *const checkedArraySrc = checkedSrc->AsRegOpnd()->AsArrayRegOpnd();
                        if(removeHeadSegmentSym && checkedArraySrc->HeadSegmentSym() == arrayOpnd->HeadSegmentSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating head segment sym
                            removeHeadSegmentSym = false;
                        }
                        if(removeHeadSegmentLengthSym &&
                            checkedArraySrc->HeadSegmentLengthSym() == arrayOpnd->HeadSegmentLengthSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating head segment length sym
                            removeHeadSegmentLengthSym = false;
                        }
                        if(removeLengthSym && checkedArraySrc->LengthSym() == arrayOpnd->LengthSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating a length sym
                            removeLengthSym = false;
                        }
                    }
                }
            }
        }
        else
        {
            Assert(removeHeadSegmentLengthSym);

            // A typed array's head segment length may be zeroed when the typed array's buffer is transferred to a web worker,
            // so the head segment length sym use is included in a NoImplicitCallUses instruction. Since there are no forward
            // uses of any head segment length syms, to allow removing the extracted head segment length
            // load, the corresponding head segment length sym use in the NoImplicitCallUses instruction must also be
            // removed.
            IR::Opnd *const use =
                FindNoImplicitCallUse(
                    instr,
                    arrayOpnd->HeadSegmentLengthSym(),
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        return checkedSrc->AsRegOpnd()->m_sym == arrayOpnd->HeadSegmentLengthSym();
                    });
            if(use)
            {
                // Implicit calls will be disabled to the point immediately before this instruction
                removeHeadSegmentLengthSym = false;
            }
        }
    }

    if(changeArray || changeNativeArray)
    {
        if(arrayOpnd)
        {
            opnd = arrayOpnd->CopyAsRegOpnd(opndOwnerInstr->m_func);
            if (origOpnd->IsIndirOpnd())
            {
                origOpnd->AsIndirOpnd()->ReplaceBaseOpnd(opnd->AsRegOpnd());
            }
            else
            {
                opndOwnerInstr->Replace(arrayOpnd, opnd);
            }
            arrayOpnd = nullptr;
        }
        opnd->SetValueType(valueType.ToLikely());
    }
    else
    {
        if(changeNoMissingValues)
        {
            opnd->SetValueType(valueType.SetHasNoMissingValues(false));
        }
        if(removeHeadSegmentSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveHeadSegmentSym();
        }
        if(removeHeadSegmentLengthSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveHeadSegmentLengthSym();
        }
        if(removeLengthSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveLengthSym();
        }
    }
}